

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

int biomesToImage(uchar *pixels,uchar (*biomeColors) [3],int *biomes,uint sx,uint sy,uint pixscale,
                 int flip)

{
  uchar uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uchar uVar8;
  uint uVar9;
  int iVar10;
  uchar uVar11;
  int local_58;
  
  if (sy == 0) {
    local_58 = 0;
  }
  else {
    uVar4 = 0;
    local_58 = 0;
    do {
      if (sx != 0) {
        iVar10 = 0;
        uVar6 = 0;
        do {
          uVar5 = (ulong)(uint)biomes[uVar4 * sx + (int)uVar6];
          if (uVar5 < 0x100) {
            uVar8 = biomeColors[uVar5][0];
            uVar1 = biomeColors[uVar5][1];
            uVar11 = biomeColors[uVar5][2];
          }
          else {
            uVar2 = biomes[uVar4 * sx + (int)uVar6] & 0x7f;
            uVar9 = biomeColors[uVar2][0] - 0x28;
            uVar3 = biomeColors[uVar2][1] - 0x28;
            uVar2 = biomeColors[uVar2][2] - 0x28;
            if (0xff < uVar9) {
              uVar9 = 0;
            }
            uVar8 = (uchar)uVar9;
            if (0xff < uVar3) {
              uVar3 = 0;
            }
            uVar1 = (uchar)uVar3;
            if (0xff < uVar2) {
              uVar2 = 0;
            }
            uVar11 = (uchar)uVar2;
            local_58 = 1;
          }
          if (pixscale != 0) {
            uVar9 = 0;
            do {
              uVar3 = ~uVar4 + sy;
              if (flip != 0) {
                uVar3 = uVar4;
              }
              iVar7 = ((uVar9 + uVar3 * pixscale) * pixscale * sx + iVar10) * 3;
              uVar3 = pixscale;
              do {
                pixels[iVar7] = uVar8;
                pixels[(long)iVar7 + 1] = uVar1;
                pixels[(long)iVar7 + 2] = uVar11;
                iVar7 = iVar7 + 3;
                uVar3 = uVar3 - 1;
              } while (uVar3 != 0);
              uVar9 = uVar9 + 1;
            } while (uVar9 != pixscale);
          }
          uVar6 = uVar6 + 1;
          iVar10 = iVar10 + pixscale;
        } while (uVar6 != sx);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != sy);
  }
  return local_58;
}

Assistant:

int biomesToImage(unsigned char *pixels,
        unsigned char biomeColors[256][3], const int *biomes,
        const unsigned int sx, const unsigned int sy,
        const unsigned int pixscale, const int flip)
{
    unsigned int i, j;
    int containsInvalidBiomes = 0;

    for (j = 0; j < sy; j++)
    {
        for (i = 0; i < sx; i++)
        {
            int id = biomes[j*sx+i];
            unsigned int r, g, b;

            if (id < 0 || id >= 256)
            {
                // This may happen for some intermediate layers
                containsInvalidBiomes = 1;
                r = biomeColors[id&0x7f][0]-40; r = (r>0xff) ? 0x00 : r&0xff;
                g = biomeColors[id&0x7f][1]-40; g = (g>0xff) ? 0x00 : g&0xff;
                b = biomeColors[id&0x7f][2]-40; b = (b>0xff) ? 0x00 : b&0xff;
            }
            else
            {
                r = biomeColors[id][0];
                g = biomeColors[id][1];
                b = biomeColors[id][2];
            }

            unsigned int m, n;
            for (m = 0; m < pixscale; m++) {
                for (n = 0; n < pixscale; n++) {
                    int idx = pixscale * i + n;
                    if (flip)
                        idx += (sx * pixscale) * ((pixscale * j) + m);
                    else
                        idx += (sx * pixscale) * ((pixscale * (sy-1-j)) + m);

                    unsigned char *pix = pixels + 3*idx;
                    pix[0] = (unsigned char)r;
                    pix[1] = (unsigned char)g;
                    pix[2] = (unsigned char)b;
                }
            }
        }
    }

    return containsInvalidBiomes;
}